

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O2

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::~BGIP_SolverBranchAndBound
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this)

{
  ~BGIP_SolverBranchAndBound(this);
  operator_delete(this,0x208);
  return;
}

Assistant:

double Solve()
    {
        _m_solved=true;
        this->InitDeadline();
        if(_m_verbosity>=1)
            std::cout << "BGIP_SolverBranchAndBound::Solve() called."<<std::endl;
        // Compute upper bound heuristic values
        ComputeCompleteInformationValues();
        
        // Reorder the joint types
        ReOrderJointTypes(_m_jtIndexMapping); 

        if(_m_verbosity>=1)
            std::cout
                << "BGIP_SolverBranchAndBound Resulting order of joint types: "
                << SoftPrintVector(_m_jtIndexMapping) << std::endl;

        // Initialize root node
        BGIP_BnB_NodePtr root;
        // If we want to update the joint type index mapping during the
        // search, we have to maintain it for each node. Otherwise we can
        // just use the copy in this class.
#if DYNAMIC_JT_INDEX_MAPPING
        if(_m_reComputeJTIndexMapping)
            root = new BGIP_BnB_Node(_m_bgip, _m_maxDepth,
                                     _m_jtIndexMapping);
        else
#endif
            root = BGIP_BnB_NodePtr(new BGIP_BnB_Node(_m_bgip->GetNrAgents()));
        // G is initialized to 0,
        // H is also initialized to 0, so we now *add* the contributions for each joint type
        for(Index jt_bgI=0;jt_bgI!=_m_bgip->GetNrJointTypes();++jt_bgI)
            root->UpdateH(_m_completeInformationValues.at(jt_bgI));

        // push the root node on the queue of open nodes
        _m_openQueue->push(root);

        if(_m_verbosity>3)
            std::cout << "BGIP_SolverBranchAndBound "
                      << root->SoftPrint() << std::endl;

        return(ReSolve());
    }